

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

void __thiscall rengine::TestBase::addTest(TestBase *this,StaticRenderTest *test)

{
  StaticRenderTest *local_18;
  StaticRenderTest *test_local;
  TestBase *this_local;
  
  local_18 = test;
  test_local = (StaticRenderTest *)this;
  std::__cxx11::list<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>::
  push_back(&this->tests,&local_18);
  Surface::requestRender((Surface *)this);
  return;
}

Assistant:

void addTest(StaticRenderTest *test) {
        tests.push_back(test);
        requestRender();
    }